

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O1

exr_result_t unpack_32bit(exr_decode_pipeline_t *decode)

{
  short sVar1;
  int iVar2;
  exr_coding_channel_info_t *peVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  uint8_t *__dest;
  long lVar7;
  void *__src;
  long lVar8;
  
  lVar4 = (long)(decode->chunk).height;
  if (0 < lVar4) {
    sVar1 = decode->channel_count;
    __src = decode->unpacked_buffer;
    lVar7 = 0;
    do {
      if (0 < sVar1) {
        lVar6 = 0;
        do {
          peVar3 = decode->channels;
          lVar8 = (long)peVar3[lVar6].width;
          iVar2 = peVar3[lVar6].user_pixel_stride;
          __dest = peVar3[lVar6].field_12.decode_to_ptr + peVar3[lVar6].user_line_stride * lVar7;
          if ((long)iVar2 == 4) {
            memcpy(__dest,__src,lVar8 * 4);
          }
          else if (0 < peVar3[lVar6].width) {
            lVar5 = 0;
            do {
              *(undefined4 *)__dest = *(undefined4 *)((long)__src + lVar5 * 4);
              __dest = __dest + iVar2;
              lVar5 = lVar5 + 1;
            } while (lVar8 != lVar5);
          }
          __src = (void *)((long)__src + lVar8 * 4);
          lVar6 = lVar6 + 1;
        } while (lVar6 != sVar1);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != lVar4);
  }
  return 0;
}

Assistant:

static exr_result_t
unpack_32bit (exr_decode_pipeline_t* decode)
{
    /* we know we're unpacking all the channels and there is no subsampling */
    const uint8_t* srcbuffer = (const uint8_t*) decode->unpacked_buffer;
    uint8_t*       cdata;
    int64_t        w, h, pixincrement;
    int            chans = decode->channel_count;

    h = (int64_t) decode->chunk.height;

    for (int64_t y = 0; y < h; ++y)
    {
        for (int c = 0; c < chans; ++c)
        {
            exr_coding_channel_info_t* decc = (decode->channels + c);

            cdata        = decc->decode_to_ptr;
            w            = decc->width;
            pixincrement = decc->user_pixel_stride;
            cdata += y * (int64_t) decc->user_line_stride;
            /* specialize to memcpy if we can */
#if EXR_HOST_IS_NOT_LITTLE_ENDIAN
            if (pixincrement == 4)
            {
                uint32_t*       tmp = (uint32_t*) cdata;
                const uint32_t* src = (const uint32_t*) srcbuffer;
                uint32_t*       end = tmp + w;

                while (tmp < end)
                    *tmp++ = le32toh (*src++);
            }
            else
            {
                const uint32_t* src = (const uint32_t*) srcbuffer;
                for (int64_t x = 0; x < w; ++x)
                {
                    *((uint32_t*) cdata) = le32toh (*src++);
                    cdata += pixincrement;
                }
            }
#else
            if (pixincrement == 4)
            {
                memcpy (cdata, srcbuffer, (size_t) (w) *4);
            }
            else
            {
                const uint32_t* src = (const uint32_t*) srcbuffer;
                for (int64_t x = 0; x < w; ++x)
                {
                    *((uint32_t*) cdata) = *src++;
                    cdata += pixincrement;
                }
            }
#endif
            srcbuffer += w * 4;
        }
    }
    return EXR_ERR_SUCCESS;
}